

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

void Abc_NtkPrintFanoutProfile(Abc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *p;
  char *pcVar4;
  float fVar5;
  float fVar6;
  uint local_1c;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  
  uVar1 = Abc_ObjId(pObj);
  uVar2 = Abc_ObjFanoutNum(pObj);
  printf("Obj %6d fanouts (%d):\n",(ulong)uVar1,(ulong)uVar2);
  for (local_1c = 0; iVar3 = Abc_ObjFanoutNum(pObj), (int)local_1c < iVar3; local_1c = local_1c + 1)
  {
    p = Abc_ObjFanout(pObj,local_1c);
    fVar5 = Bus_SclObjETime(p);
    fVar6 = Bus_SclObjCin(p);
    printf("%3d : time = %7.2f ps   load = %7.2f ff  ",(double)fVar5,(double)fVar6,(ulong)local_1c);
    iVar3 = Abc_NodeFindFanin(p,pObj);
    iVar3 = Abc_ObjFaninPhase(p,iVar3);
    pcVar4 = " ";
    if (iVar3 != 0) {
      pcVar4 = "*";
    }
    printf("%s\n",pcVar4);
  }
  printf("\n");
  return;
}

Assistant:

void Abc_NtkPrintFanoutProfile( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    printf( "Obj %6d fanouts (%d):\n", Abc_ObjId(pObj), Abc_ObjFanoutNum(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        printf( "%3d : time = %7.2f ps   load = %7.2f ff  ", i, Bus_SclObjETime(pFanout), Bus_SclObjCin(pFanout) );
        printf( "%s\n", Abc_ObjFaninPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) ) ? "*" : " " );
    }
    printf( "\n" );
}